

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DwaCompressor::LossyDctDecoderBase::LossyDctDecoderBase
          (LossyDctDecoderBase *this,char *packedAc,char *packedAcEnd,char *packedDc,
          unsigned_short *toLinear,int width,int height)

{
  this->_vptr_LossyDctDecoderBase = (_func_int **)&PTR__LossyDctDecoderBase_003d6600;
  this->_packedAcCount = 0;
  this->_packedDcCount = 0;
  this->_packedAc = packedAc;
  this->_packedAcEnd = packedAcEnd;
  this->_packedDc = packedDc;
  this->_toLinear = toLinear;
  this->_width = width;
  this->_height = height;
  (this->_rowPtrs).
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rowPtrs).
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rowPtrs).
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_type).super__Vector_base<Imf_3_2::PixelType,_std::allocator<Imf_3_2::PixelType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_type).super__Vector_base<Imf_3_2::PixelType,_std::allocator<Imf_3_2::PixelType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_type).super__Vector_base<Imf_3_2::PixelType,_std::allocator<Imf_3_2::PixelType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_dctData).
  super__Vector_base<Imf_3_2::SimdAlignedBuffer64<float>,_std::allocator<Imf_3_2::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_dctData).
  super__Vector_base<Imf_3_2::SimdAlignedBuffer64<float>,_std::allocator<Imf_3_2::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_dctData).
  super__Vector_base<Imf_3_2::SimdAlignedBuffer64<float>,_std::allocator<Imf_3_2::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (toLinear == (unsigned_short *)0x0) {
    this->_toLinear = (unsigned_short *)dwaCompressorNoOp;
  }
  this->_isNativeXdr = (bool)GLOBAL_SYSTEM_LITTLE_ENDIAN;
  return;
}

Assistant:

DwaCompressor::LossyDctDecoderBase::LossyDctDecoderBase (
    char*                 packedAc,
    char*                 packedAcEnd,
    char*                 packedDc,
    const unsigned short* toLinear,
    int                   width,
    int                   height)
    : _isNativeXdr (false)
    , _packedAcCount (0)
    , _packedDcCount (0)
    , _packedAc (packedAc)
    , _packedAcEnd (packedAcEnd)
    , _packedDc (packedDc)
    , _toLinear (toLinear)
    , _width (width)
    , _height (height)
{
    if (_toLinear == 0) _toLinear = dwaCompressorNoOp;

    _isNativeXdr = GLOBAL_SYSTEM_LITTLE_ENDIAN;
}